

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O0

int Sto_ManMemoryReport(Sto_Man_t *p)

{
  char *pNext;
  char *pMem;
  int Total;
  Sto_Man_t *p_local;
  
  if (p->pChunkLast == (char *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    pMem._4_4_ = p->nChunkUsed;
    pNext = p->pChunkLast;
    while (pNext = *(char **)pNext, pNext != (char *)0x0) {
      pMem._4_4_ = p->nChunkSize + pMem._4_4_;
    }
    p_local._4_4_ = pMem._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

int Sto_ManMemoryReport( Sto_Man_t * p )
{
    int Total;
    char * pMem, * pNext;
    if ( p->pChunkLast == NULL )
        return 0;
    Total = p->nChunkUsed; 
    for ( pMem = p->pChunkLast; (pNext = *(char **)pMem); pMem = pNext )
        Total += p->nChunkSize;
    return Total;
}